

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O1

boolean ecx_configdc(ecx_contextt *context)

{
  byte bVar1;
  ushort uVar2;
  ec_slavet *peVar3;
  ec_groupt *peVar4;
  int iVar5;
  uint8 uVar6;
  int32 iVar7;
  int32 iVar8;
  int iVar9;
  uint8 *puVar10;
  bool bVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar15;
  ulong uVar16;
  uint16 uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  undefined8 unaff_R14;
  byte bVar21;
  int32 ht;
  int8 plist [4];
  int32 tlist [4];
  int64 hrt;
  int local_78;
  byte local_74 [4];
  ec_slavet *local_70;
  int32 local_68;
  int local_64;
  int local_60;
  int local_5c;
  int32 local_58;
  int32 local_54;
  uint local_50;
  uint local_4c;
  ecx_contextt *local_48;
  ulong local_40;
  long local_38;
  ulong uVar14;
  
  context->slavelist->hasdc = '\0';
  context->grouplist->hasdc = '\0';
  local_78 = 0;
  ecx_BWR(context->port,0,0x900,4,&local_78,2000);
  if (0 < *context->slavecount) {
    uVar13 = CONCAT62((int6)((ulong)unaff_R14 >> 0x10),1);
    uVar14 = 0;
    uVar12 = 0;
    local_48 = context;
    do {
      uVar20 = (uint)uVar13;
      peVar3 = context->slavelist;
      uVar17 = (uint16)uVar13;
      uVar16 = uVar13 & 0xffff;
      peVar3[uVar16].consumedports = peVar3[uVar16].activeports;
      if (peVar3[uVar16].hasdc == '\0') {
        peVar3[uVar16].DCrtA = 0;
        peVar3[uVar16].DCrtB = 0;
        peVar3[uVar16].DCrtC = 0;
        peVar3[uVar16].DCrtD = 0;
        uVar13 = (ulong)peVar3[uVar16].parent;
        if (uVar13 != 0) {
          if (peVar3[uVar13].topology < 3) {
            uVar13 = (ulong)uVar12;
          }
          uVar12 = (uint)uVar13;
        }
        if (((uint16)uVar12 != 0) && (peVar3[uVar16].topology == '\x01')) {
          ecx_parentport(context,(uint16)uVar12);
          uVar12 = 0;
        }
      }
      else {
        if (peVar3->hasdc == '\0') {
          peVar3->hasdc = '\x01';
          peVar3->DCnext = uVar17;
          peVar3[uVar16].DCprevious = 0;
          peVar4 = context->grouplist;
          peVar4->hasdc = '\x01';
          peVar4->DCnext = uVar17;
        }
        else {
          peVar3[uVar14 & 0xffff].DCnext = uVar17;
          peVar3[uVar16].DCprevious = (uint16)uVar14;
        }
        uVar2 = peVar3[uVar16].configadr;
        local_40 = uVar16;
        ecx_FPRD(context->port,uVar2,0x900,4,&local_78,2000);
        context->slavelist[uVar16].DCrtA = local_78;
        ecx_FPRD(context->port,uVar2,0x918,8,&local_38,2000);
        local_38 = -local_38;
        ecx_FPWR(context->port,uVar2,0x920,8,&local_38,2000);
        ecx_FPRD(context->port,uVar2,0x904,4,&local_78,2000);
        context->slavelist[uVar16].DCrtB = local_78;
        ecx_FPRD(context->port,uVar2,0x908,4,&local_78,2000);
        context->slavelist[uVar16].DCrtC = local_78;
        local_4c = (uint)uVar2;
        ecx_FPRD(context->port,uVar2,0x90c,4,&local_78,2000);
        peVar3 = context->slavelist;
        peVar3[uVar16].DCrtD = local_78;
        bVar1 = peVar3[uVar16].activeports;
        bVar21 = (bVar1 & 1) != 0;
        if ((bool)bVar21) {
          local_74[0] = 0;
          local_68 = peVar3[uVar16].DCrtA;
        }
        if ((bVar1 & 8) != 0) {
          local_74[bVar21] = 3;
          (&local_68)[bVar21] = local_78;
          bVar21 = bVar21 + 1;
        }
        if ((bVar1 & 2) != 0) {
          local_74[bVar21] = 1;
          (&local_68)[bVar21] = peVar3[uVar16].DCrtB;
          bVar21 = bVar21 + 1;
        }
        if ((bVar1 & 4) != 0) {
          local_74[bVar21] = 2;
          (&local_68)[bVar21] = peVar3[uVar16].DCrtC;
          bVar21 = bVar21 + 1;
        }
        bVar11 = local_64 < local_68 && 1 < bVar21;
        uVar14 = (ulong)bVar11;
        if ((2 < bVar21) && (uVar14 = (ulong)bVar11, local_60 < (&local_68)[uVar14])) {
          uVar14 = 2;
        }
        if ((3 < bVar21) && (local_5c < (&local_68)[uVar14])) {
          uVar14 = 3;
        }
        bVar1 = local_74[uVar14];
        peVar3[uVar16].entryport = bVar1;
        peVar3[uVar16].consumedports = peVar3[uVar16].consumedports & ~(byte)(1 << (bVar1 & 0x1f));
        uVar14 = uVar13 & 0xffffffff;
        do {
          uVar15 = uVar14 & 0xffff;
          uVar2 = peVar3[uVar15].parent;
          uVar14 = (ulong)uVar2;
          if (uVar14 == 0) goto LAB_00109a79;
        } while (peVar3[uVar14].hasdc == '\0');
        local_50 = uVar20;
        uVar6 = ecx_parentport(context,uVar2);
        local_70 = context->slavelist;
        puVar10 = &local_70[uVar16].parentport;
        *puVar10 = uVar6;
        if (local_70[uVar14].topology == '\x01') {
          *puVar10 = local_70[uVar14].entryport;
        }
        uVar6 = *puVar10;
        local_54 = ecx_porttime(context,uVar2,uVar6);
        uVar6 = ecx_prevport(context,uVar2,uVar6);
        iVar7 = ecx_porttime(context,uVar2,uVar6);
        iVar18 = 0;
        if (1 < local_70[uVar16].topology) {
          uVar17 = (uint16)local_40;
          local_58 = iVar7;
          uVar6 = ecx_prevport(context,uVar17,local_70[uVar16].entryport);
          iVar7 = ecx_porttime(context,uVar17,uVar6);
          iVar8 = ecx_porttime(context,(uint16)local_40,local_70[uVar16].entryport);
          iVar18 = iVar7 - iVar8;
          iVar7 = local_58;
        }
        iVar19 = 0;
        iVar9 = local_54 - iVar7;
        iVar5 = -iVar18;
        if (iVar9 < iVar18) {
          iVar5 = iVar18;
        }
        if (1 < (int)((int)uVar15 - (uint)uVar2)) {
          iVar8 = ecx_porttime(local_48,uVar2,local_70[uVar14].entryport);
          iVar19 = iVar7 - iVar8;
        }
        context = local_48;
        iVar18 = -iVar19;
        if (0 < iVar19) {
          iVar18 = iVar19;
        }
        local_78 = (iVar5 + iVar9) / 2 + iVar18 + local_70[uVar14].pdelay;
        local_70[uVar16].pdelay = local_78;
        ecx_FPWR(local_48->port,(uint16)local_4c,0x928,4,&local_78,2000);
        uVar13 = (ulong)local_50;
LAB_00109a79:
        uVar12 = 0;
        uVar20 = (uint)uVar13;
        uVar14 = uVar13 & 0xffffffff;
      }
      uVar13 = (ulong)(uVar20 + 1);
    } while ((int)(uVar20 + 1 & 0xffff) <= *context->slavecount);
  }
  return context->slavelist->hasdc;
}

Assistant:

boolean ecx_configdc(ecx_contextt *context)
{
   uint16 i, wc, slaveh, parent, child;
   uint16 parenthold = 0;
   uint16 prevDCslave = 0;
   int32 ht, dt1, dt2, dt3;
   int64 hrt;
   uint8 entryport;
   int8 nlist;
   int8 plist[4];
   int32 tlist[4];

   context->slavelist[0].hasdc = FALSE;
   context->grouplist[0].hasdc = FALSE;
   ht = 0;
   ecx_BWR(context->port, 0, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);  /* latch DCrecvTimeA of all slaves */
   for (i = 1; i <= *(context->slavecount); i++)
   {
      context->slavelist[i].consumedports = context->slavelist[i].activeports;
      if (context->slavelist[i].hasdc)
      {
         if (!context->slavelist[0].hasdc)
         {
            context->slavelist[0].hasdc = TRUE;
            context->slavelist[0].DCnext = i;
            context->slavelist[i].DCprevious = 0;
            context->grouplist[0].hasdc = TRUE;
            context->grouplist[0].DCnext = i;
         }
         else
         {
            context->slavelist[prevDCslave].DCnext = i;
            context->slavelist[i].DCprevious = prevDCslave;
         }
         /* this branch has DC slave so remove parenthold */
         parenthold = 0;
         prevDCslave = i;
         slaveh = context->slavelist[i].configadr;
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtA = etohl(ht);
         /* 64bit latched DCrecvTimeA of each specific slave */
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSOF, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         /* use it as offset in order to set local time around 0 */
         hrt = htoell(-etohll(hrt));
         /* save it in the offset register */
         wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSOFFSET, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME1, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtB = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME2, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtC = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME3, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtD = etohl(ht);

         /* make list of active ports and their time stamps */
         nlist = 0;
         if (context->slavelist[i].activeports & PORTM0) 
         {
            plist[nlist] = 0;
            tlist[nlist] = context->slavelist[i].DCrtA;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM3) 
         {
            plist[nlist] = 3;
            tlist[nlist] = context->slavelist[i].DCrtD;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM1) 
         {
            plist[nlist] = 1;
            tlist[nlist] = context->slavelist[i].DCrtB;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM2) 
         {
            plist[nlist] = 2;
            tlist[nlist] = context->slavelist[i].DCrtC;
            nlist++;
         }
         /* entryport is port with the lowest timestamp */
         entryport = 0;
         if((nlist > 1) && (tlist[1] < tlist[entryport]))
         {
            entryport = 1;
         }         
         if((nlist > 2) && (tlist[2] < tlist[entryport]))
         {
            entryport = 2;
         }
         if((nlist > 3) && (tlist[3] < tlist[entryport]))
         {
            entryport = 3;
         }
         entryport = plist[entryport];
         context->slavelist[i].entryport = entryport;
         /* consume entryport from activeports */
         context->slavelist[i].consumedports &= (uint8)~(1 << entryport);

         /* finding DC parent of current */
         parent = i;
         do
         {
            child = parent;
            parent = context->slavelist[parent].parent;
         }
         while (!((parent == 0) || (context->slavelist[parent].hasdc)));
         /* only calculate propagation delay if slave is not the first */
         if (parent > 0)
         {
            /* find port on parent this slave is connected to */
            context->slavelist[i].parentport = ecx_parentport(context, parent);
            if (context->slavelist[parent].topology == 1)
            {
               context->slavelist[i].parentport = context->slavelist[parent].entryport;
            }

            dt1 = 0;
            dt2 = 0;
            /* delta time of (parentport - 1) - parentport */
            /* note: order of ports is 0 - 3 - 1 -2 */
            /* non active ports are skipped */
            dt3 = ecx_porttime(context, parent, context->slavelist[i].parentport) -
                  ecx_porttime(context, parent, 
                    ecx_prevport(context, parent, context->slavelist[i].parentport));
            /* current slave has children */
            /* those childrens delays need to be substacted */
            if (context->slavelist[i].topology > 1)
            {
               dt1 = ecx_porttime(context, i, 
                        ecx_prevport(context, i, context->slavelist[i].entryport)) -
                     ecx_porttime(context, i, context->slavelist[i].entryport);
            }
            /* we are only interrested in positive diference */
            if (dt1 > dt3) dt1 = -dt1;
            /* current slave is not the first child of parent */
            /* previous childs delays need to be added */
            if ((child - parent) > 1)
            {
               dt2 = ecx_porttime(context, parent, 
                        ecx_prevport(context, parent, context->slavelist[i].parentport)) -
                     ecx_porttime(context, parent, context->slavelist[parent].entryport);
            }
            if (dt2 < 0) dt2 = -dt2;

            /* calculate current slave delay from delta times */
            /* assumption : forward delay equals return delay */
            context->slavelist[i].pdelay = ((dt3 - dt1) / 2) + dt2 +
               context->slavelist[parent].pdelay;
            ht = htoel(context->slavelist[i].pdelay);
            /* write propagation delay*/
            wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSDELAY, sizeof(ht), &ht, EC_TIMEOUTRET);
         }
      }
      else
      {
         context->slavelist[i].DCrtA = 0;
         context->slavelist[i].DCrtB = 0;
         context->slavelist[i].DCrtC = 0;
         context->slavelist[i].DCrtD = 0;
         parent = context->slavelist[i].parent;
         /* if non DC slave found on first position on branch hold root parent */
         if ( (parent > 0) && (context->slavelist[parent].topology > 2))
            parenthold = parent;
         /* if branch has no DC slaves consume port on root parent */
         if ( parenthold && (context->slavelist[i].topology == 1))
         {
            ecx_parentport(context, parenthold);
            parenthold = 0;
         }
      }
   }

   return context->slavelist[0].hasdc;
}